

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::cftfsub(int n,double *a,int *ip,int nw,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (n < 9) {
    if (n == 4) {
      dVar1 = *a;
      dVar2 = a[1];
      *a = dVar1 + a[2];
      a[1] = dVar2 + a[3];
      a[2] = dVar1 - a[2];
      a[3] = dVar2 - a[3];
    }
    else if (n == 8) {
      cftf040(a);
      return;
    }
  }
  else {
    if (0x20 < (uint)n) {
      cftf1st(n,a,w + (int)(nw - ((uint)n >> 2)));
      if ((uint)n < 0x201) {
        if ((uint)n < 0x81) {
          cftfx41(n,a,nw,w);
        }
        else {
          cftleaf(n,1,a,nw,w);
        }
      }
      else {
        cftrec4(n,a,nw,w);
      }
      bitrv2(n,ip,a);
      return;
    }
    if (n == 0x20) {
      cftf161(a,w + (long)nw + -8);
      bitrv216(a);
      return;
    }
    cftf081(a,w);
    dVar1 = a[2];
    dVar2 = a[3];
    dVar3 = a[6];
    dVar4 = a[7];
    a[2] = a[8];
    a[3] = a[9];
    a[8] = dVar1;
    a[9] = dVar2;
    a[6] = a[0xc];
    a[7] = a[0xd];
    a[0xc] = dVar3;
    a[0xd] = dVar4;
  }
  return;
}

Assistant:

void cftfsub(int n, double *a, int *ip, int nw, double *w) {
#if 0
  void bitrv2(int n, int *ip, double *a);
  void bitrv216(double *a);
  void bitrv208(double *a);
  void cftf1st(int n, double *a, double *w);
  void cftrec4(int n, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftfx41(int n, double *a, int nw, double *w);
  void cftf161(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf040(double *a);
  void cftx020(double *a);
#endif

  if (n > 8) {
    if (n > 32) {
      cftf1st(n, a, &w[nw - (n >> 2)]);
    if (n > 512) {
      cftrec4(n, a, nw, w);
    } else if (n > 128) {
      cftleaf(n, 1, a, nw, w);
    } else {
      cftfx41(n, a, nw, w);
    }
      bitrv2(n, ip, a);
    } else if (n == 32) {
      cftf161(a, &w[nw - 8]);
      bitrv216(a);
    } else {
      cftf081(a, w);
      bitrv208(a);
    }
  } else if (n == 8) {
    cftf040(a);
  } else if (n == 4) {
    cftx020(a);
  }
}